

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_logit_bias_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_token_data *plVar1;
  llama_sampler_context_t pvVar2;
  llama_logit_bias *plVar3;
  llama_token_data *plVar4;
  iterator __position;
  int *piVar5;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  iterator __begin2;
  int *piVar10;
  const_iterator __begin1;
  llama_logit_bias *__args;
  
  pvVar2 = smpl->ctx;
  __args = *(llama_logit_bias **)((long)pvVar2 + 8);
  plVar3 = *(llama_logit_bias **)((long)pvVar2 + 0x10);
  if (__args != plVar3) {
    if (*(long *)((long)pvVar2 + 0x28) != *(long *)((long)pvVar2 + 0x20)) {
      *(long *)((long)pvVar2 + 0x28) = *(long *)((long)pvVar2 + 0x20);
    }
    do {
      uVar8 = (ulong)__args->token;
      if ((((long)uVar8 < 0) || (cur_p->size <= uVar8)) ||
         (plVar4 = cur_p->data, plVar4[uVar8].id != __args->token)) {
        __position._M_current = *(llama_logit_bias **)((long)pvVar2 + 0x28);
        if (__position._M_current == *(llama_logit_bias **)((long)pvVar2 + 0x30)) {
          std::vector<llama_logit_bias,std::allocator<llama_logit_bias>>::
          _M_realloc_insert<llama_logit_bias_const&>
                    ((vector<llama_logit_bias,std::allocator<llama_logit_bias>> *)
                     ((long)pvVar2 + 0x20),__position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(long *)((long)pvVar2 + 0x28) = *(long *)((long)pvVar2 + 0x28) + 8;
        }
      }
      else {
        plVar4[uVar8].logit = __args->bias + plVar4[uVar8].logit;
      }
      __args = __args + 1;
    } while (__args != plVar3);
    piVar5 = *(int **)((long)pvVar2 + 0x20);
    piVar6 = *(int **)((long)pvVar2 + 0x28);
    if ((piVar5 != piVar6) && (sVar7 = cur_p->size, sVar7 != 0)) {
      plVar4 = cur_p->data;
      sVar9 = 0;
      do {
        plVar1 = plVar4 + sVar9;
        piVar10 = piVar5;
        do {
          if (plVar1->id == *piVar10) {
            plVar1->logit = (float)piVar10[1] + plVar1->logit;
            break;
          }
          piVar10 = piVar10 + 2;
        } while (piVar10 != piVar6);
        sVar9 = sVar9 + 1;
      } while (sVar9 != sVar7);
    }
  }
  return;
}

Assistant:

static void llama_sampler_logit_bias_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_logit_bias *) smpl->ctx;

    if (ctx->logit_bias.empty()) {
        return;
    }

    ctx->to_search.clear();

    // update the candidates that have not been shuffled in the vocabulary (i.e. idx == id)
    for (const auto & lb : ctx->logit_bias) {
        if (lb.token >= 0 && cur_p->size > (size_t) lb.token && cur_p->data[lb.token].id == lb.token) {
            cur_p->data[lb.token].logit += lb.bias;
        } else {
            ctx->to_search.push_back(lb);
        }
    }

    if (ctx->to_search.empty()) {
        return;
    }

    // search for the remaining candidates that were not found in the previous step
    for (size_t i = 0; i < cur_p->size; ++i) {
        for (const auto & lb : ctx->to_search) {
            if (cur_p->data[i].id == lb.token) {
                cur_p->data[i].logit += lb.bias;
                break;
            }
        }
    }
}